

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_line_buffer.cpp
# Opt level: O0

void __thiscall
NshLineBufferAppendChar_FailureFull_Test::~NshLineBufferAppendChar_FailureFull_Test
          (NshLineBufferAppendChar_FailureFull_Test *this)

{
  NshLineBufferAppendChar_FailureFull_Test *this_local;
  
  ~NshLineBufferAppendChar_FailureFull_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshLineBufferAppendChar, FailureFull)
{
    nsh_line_buffer_t line;
    nsh_line_buffer_reset(&line);

    for (unsigned int i = 0; i < NSH_LINE_BUFFER_SIZE; i++) {
        ASSERT_EQ(nsh_line_buffer_append_char(&line, 'a'), NSH_STATUS_OK);
    }

    auto status = nsh_line_buffer_append_char(&line, 'z');

    ASSERT_EQ(status, NSH_STATUS_BUFFER_OVERFLOW);
    ASSERT_EQ(line.size, NSH_LINE_BUFFER_SIZE);
}